

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.cpp
# Opt level: O0

void getB64SignatureForHash(char *sigb64,uint8_t *privateKey,uint8_t *hash,size_t length)

{
  uint hash_size;
  uECC_Curve curve;
  uint8_t local_68 [8];
  uint8_t signature [64];
  size_t length_local;
  uint8_t *hash_local;
  uint8_t *privateKey_local;
  char *sigb64_local;
  
  signature._56_8_ = length;
  do {
    hash_size = (uint)signature._56_8_;
    curve = uECC_secp256k1();
    uECC_sign(privateKey,hash,hash_size,local_68,curve);
  } while (0x79 < signature[0x18]);
  Base64Class::encode((Base64Class *)&Base64,sigb64,(char *)local_68,0x40);
  return;
}

Assistant:

void getB64SignatureForHash(char * sigb64, const uint8_t * privateKey, const uint8_t * hash,size_t length){

	uint8_t signature[64];
	do {
		uECC_sign(privateKey, hash, length, signature, uECC_secp256k1());
//		FEED_WATCHDOG;
	} while (signature[32] > 0x79);//hub would refuse a high-s signature
	Base64.encode(sigb64, (char *) signature, 64);

}